

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O0

int tcu::anon_unknown_47::findNumPositionDeviationFailingPixels
              (PixelBufferAccess *errorMask,ConstPixelBufferAccess *reference,
              ConstPixelBufferAccess *result,UVec4 *threshold,IVec3 *maxPositionDeviation,
              bool acceptOutOfBoundsAsAnyValue)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  deBool dVar7;
  InternalError *this;
  byte local_231;
  byte local_21d;
  byte local_209;
  byte local_1f5;
  byte local_1e1;
  byte local_1cd;
  int local_1b8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  Vector<bool,_4> local_195;
  undefined1 local_191;
  undefined1 local_190 [7];
  bool isOk_2;
  tcu local_180 [16];
  undefined1 local_170 [8];
  UVec4 diff_2;
  IVec4 deviatedRefPix;
  int sx_1;
  int sy_1;
  int sz_1;
  undefined1 local_13c [2];
  bool pixelFoundForResult;
  bool isOk_1;
  tcu local_12c [16];
  undefined1 local_11c [8];
  UVec4 diff_1;
  IVec4 deviatedCmpPix;
  int sx;
  int sy;
  int sz;
  undefined1 local_e8 [2];
  bool pixelFoundForReference;
  bool isOk;
  tcu local_d8 [16];
  undefined1 local_c8 [8];
  UVec4 diff;
  IVec4 cmpPix;
  IVec4 refPix;
  int x;
  int y;
  int z;
  int endZ;
  int endY;
  int endX;
  int beginZ;
  int beginY;
  int beginX;
  int numFailingPixels;
  int depth;
  int height;
  int width;
  IVec4 errorColor;
  IVec4 okColor;
  bool acceptOutOfBoundsAsAnyValue_local;
  IVec3 *maxPositionDeviation_local;
  UVec4 *threshold_local;
  ConstPixelBufferAccess *result_local;
  ConstPixelBufferAccess *reference_local;
  PixelBufferAccess *errorMask_local;
  
  Vector<int,_4>::Vector((Vector<int,_4> *)(errorColor.m_data + 2),0,0xff,0,0xff);
  Vector<int,_4>::Vector((Vector<int,_4> *)&height,0xff,0,0,0xff);
  iVar1 = ConstPixelBufferAccess::getWidth(reference);
  iVar2 = ConstPixelBufferAccess::getHeight(reference);
  iVar3 = ConstPixelBufferAccess::getDepth(reference);
  beginY = 0;
  if (acceptOutOfBoundsAsAnyValue) {
    local_19c = Vector<int,_3>::x(maxPositionDeviation);
    local_1a0 = Vector<int,_3>::y(maxPositionDeviation);
    x = Vector<int,_3>::z(maxPositionDeviation);
    iVar4 = Vector<int,_3>::x(maxPositionDeviation);
    iVar5 = Vector<int,_3>::y(maxPositionDeviation);
    iVar6 = Vector<int,_3>::z(maxPositionDeviation);
    iVar5 = iVar2 - iVar5;
    iVar4 = iVar1 - iVar4;
    local_1b8 = iVar3 - iVar6;
  }
  else {
    local_19c = 0;
    local_1a0 = 0;
    local_1a4 = 0;
    iVar5 = iVar2;
    x = local_1a4;
    iVar4 = iVar1;
    local_1b8 = iVar3;
  }
  while ((((dVar7 = ::deGetFalse(), dVar7 == 0 &&
           (iVar6 = ConstPixelBufferAccess::getWidth(result), iVar6 == iVar1)) &&
          (iVar6 = ConstPixelBufferAccess::getHeight(result), iVar6 == iVar2)) &&
         (iVar6 = ConstPixelBufferAccess::getDepth(result), iVar6 == iVar3))) {
    dVar7 = ::deGetFalse();
    if (dVar7 == 0) {
      tcu::clear(errorMask,(IVec4 *)(errorColor.m_data + 2));
      for (; refPix.m_data[3] = local_1a0, x < local_1b8; x = x + 1) {
        for (; refPix.m_data[2] = local_19c, refPix.m_data[3] < iVar5;
            refPix.m_data[3] = refPix.m_data[3] + 1) {
          for (; refPix.m_data[2] < iVar4; refPix.m_data[2] = refPix.m_data[2] + 1) {
            ConstPixelBufferAccess::getPixelInt
                      ((ConstPixelBufferAccess *)(cmpPix.m_data + 2),(int)reference,refPix.m_data[2]
                       ,refPix.m_data[3]);
            ConstPixelBufferAccess::getPixelInt
                      ((ConstPixelBufferAccess *)(diff.m_data + 2),(int)result,refPix.m_data[2],
                       refPix.m_data[3]);
            tcu::operator-((tcu *)local_e8,(Vector<int,_4> *)(cmpPix.m_data + 2),
                           (Vector<int,_4> *)(diff.m_data + 2));
            abs<int,4>(local_d8,(Vector<int,_4> *)local_e8);
            Vector<int,_4>::cast<unsigned_int>((Vector<int,_4> *)local_c8);
            lessThanEqual<unsigned_int,4>
                      ((tcu *)((long)&sy + 3),(Vector<unsigned_int,_4> *)local_c8,threshold);
            sz._3_1_ = boolAll<4>((Vector<bool,_4> *)((long)&sy + 3));
            if (!(bool)sz._3_1_) {
              sy._2_1_ = 0;
              iVar6 = Vector<int,_3>::z(maxPositionDeviation);
              sx = de::max<int>(0,x - iVar6);
              while( true ) {
                iVar6 = Vector<int,_3>::z(maxPositionDeviation);
                iVar6 = de::min<int>(iVar3 + -1,x + iVar6);
                local_1cd = 0;
                if (sx <= iVar6) {
                  local_1cd = sy._2_1_ ^ 0xff;
                }
                if ((local_1cd & 1) == 0) break;
                iVar6 = Vector<int,_3>::y(maxPositionDeviation);
                deviatedCmpPix.m_data[3] = de::max<int>(0,refPix.m_data[3] - iVar6);
                while( true ) {
                  iVar6 = Vector<int,_3>::y(maxPositionDeviation);
                  iVar6 = de::min<int>(iVar2 + -1,refPix.m_data[3] + iVar6);
                  local_1e1 = 0;
                  if (deviatedCmpPix.m_data[3] <= iVar6) {
                    local_1e1 = sy._2_1_ ^ 0xff;
                  }
                  if ((local_1e1 & 1) == 0) break;
                  iVar6 = Vector<int,_3>::x(maxPositionDeviation);
                  deviatedCmpPix.m_data[2] = de::max<int>(0,refPix.m_data[2] - iVar6);
                  while( true ) {
                    iVar6 = Vector<int,_3>::x(maxPositionDeviation);
                    iVar6 = de::min<int>(iVar1 + -1,refPix.m_data[2] + iVar6);
                    local_1f5 = 0;
                    if (deviatedCmpPix.m_data[2] <= iVar6) {
                      local_1f5 = sy._2_1_ ^ 0xff;
                    }
                    if ((local_1f5 & 1) == 0) break;
                    ConstPixelBufferAccess::getPixelInt
                              ((ConstPixelBufferAccess *)(diff_1.m_data + 2),(int)result,
                               deviatedCmpPix.m_data[2],deviatedCmpPix.m_data[3]);
                    tcu::operator-((tcu *)local_13c,(Vector<int,_4> *)(cmpPix.m_data + 2),
                                   (Vector<int,_4> *)(diff_1.m_data + 2));
                    abs<int,4>(local_12c,(Vector<int,_4> *)local_13c);
                    Vector<int,_4>::cast<unsigned_int>((Vector<int,_4> *)local_11c);
                    lessThanEqual<unsigned_int,4>
                              ((tcu *)((long)&sy_1 + 3),(Vector<unsigned_int,_4> *)local_11c,
                               threshold);
                    sz_1._3_1_ = boolAll<4>((Vector<bool,_4> *)((long)&sy_1 + 3));
                    deviatedCmpPix.m_data[2] = deviatedCmpPix.m_data[2] + 1;
                    sy._2_1_ = sz_1._3_1_;
                  }
                  deviatedCmpPix.m_data[3] = deviatedCmpPix.m_data[3] + 1;
                }
                sx = sx + 1;
              }
              if ((sy._2_1_ & 1) == 0) {
                PixelBufferAccess::setPixel
                          (errorMask,(IVec4 *)&height,refPix.m_data[2],refPix.m_data[3],x);
                beginY = beginY + 1;
              }
              else {
                sy_1._2_1_ = 0;
                iVar6 = Vector<int,_3>::z(maxPositionDeviation);
                sx_1 = de::max<int>(0,x - iVar6);
                while( true ) {
                  iVar6 = Vector<int,_3>::z(maxPositionDeviation);
                  iVar6 = de::min<int>(iVar3 + -1,x + iVar6);
                  local_209 = 0;
                  if (sx_1 <= iVar6) {
                    local_209 = sy_1._2_1_ ^ 0xff;
                  }
                  if ((local_209 & 1) == 0) break;
                  iVar6 = Vector<int,_3>::y(maxPositionDeviation);
                  deviatedRefPix.m_data[3] = de::max<int>(0,refPix.m_data[3] - iVar6);
                  while( true ) {
                    iVar6 = Vector<int,_3>::y(maxPositionDeviation);
                    iVar6 = de::min<int>(iVar2 + -1,refPix.m_data[3] + iVar6);
                    local_21d = 0;
                    if (deviatedRefPix.m_data[3] <= iVar6) {
                      local_21d = sy_1._2_1_ ^ 0xff;
                    }
                    if ((local_21d & 1) == 0) break;
                    iVar6 = Vector<int,_3>::x(maxPositionDeviation);
                    deviatedRefPix.m_data[2] = de::max<int>(0,refPix.m_data[2] - iVar6);
                    while( true ) {
                      iVar6 = Vector<int,_3>::x(maxPositionDeviation);
                      iVar6 = de::min<int>(iVar1 + -1,refPix.m_data[2] + iVar6);
                      local_231 = 0;
                      if (deviatedRefPix.m_data[2] <= iVar6) {
                        local_231 = sy_1._2_1_ ^ 0xff;
                      }
                      if ((local_231 & 1) == 0) break;
                      ConstPixelBufferAccess::getPixelInt
                                ((ConstPixelBufferAccess *)(diff_2.m_data + 2),(int)reference,
                                 deviatedRefPix.m_data[2],deviatedRefPix.m_data[3]);
                      tcu::operator-((tcu *)local_190,(Vector<int,_4> *)(diff.m_data + 2),
                                     (Vector<int,_4> *)(diff_2.m_data + 2));
                      abs<int,4>(local_180,(Vector<int,_4> *)local_190);
                      Vector<int,_4>::cast<unsigned_int>((Vector<int,_4> *)local_170);
                      lessThanEqual<unsigned_int,4>
                                ((tcu *)&local_195,(Vector<unsigned_int,_4> *)local_170,threshold);
                      local_191 = boolAll<4>(&local_195);
                      deviatedRefPix.m_data[2] = deviatedRefPix.m_data[2] + 1;
                      sy_1._2_1_ = local_191;
                    }
                    deviatedRefPix.m_data[3] = deviatedRefPix.m_data[3] + 1;
                  }
                  sx_1 = sx_1 + 1;
                }
                if ((sy_1._2_1_ & 1) == 0) {
                  PixelBufferAccess::setPixel
                            (errorMask,(IVec4 *)&height,refPix.m_data[2],refPix.m_data[3],x);
                  beginY = beginY + 1;
                }
              }
            }
          }
        }
      }
      return beginY;
    }
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  InternalError::InternalError
            (this,(char *)0x0,
             "result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageCompare.cpp"
             ,0x6c);
  __cxa_throw(this,&InternalError::typeinfo,InternalError::~InternalError);
}

Assistant:

static int findNumPositionDeviationFailingPixels (const PixelBufferAccess& errorMask, const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const UVec4& threshold, const tcu::IVec3& maxPositionDeviation, bool acceptOutOfBoundsAsAnyValue)
{
	const tcu::IVec4	okColor				(0, 255, 0, 255);
	const tcu::IVec4	errorColor			(255, 0, 0, 255);
	const int			width				= reference.getWidth();
	const int			height				= reference.getHeight();
	const int			depth				= reference.getDepth();
	int					numFailingPixels	= 0;

	// Accept pixels "sampling" over the image bounds pixels since "taps" could be anything
	const int			beginX				= (acceptOutOfBoundsAsAnyValue) ? (maxPositionDeviation.x()) : (0);
	const int			beginY				= (acceptOutOfBoundsAsAnyValue) ? (maxPositionDeviation.y()) : (0);
	const int			beginZ				= (acceptOutOfBoundsAsAnyValue) ? (maxPositionDeviation.z()) : (0);
	const int			endX				= (acceptOutOfBoundsAsAnyValue) ? (width  - maxPositionDeviation.x()) : (width);
	const int			endY				= (acceptOutOfBoundsAsAnyValue) ? (height - maxPositionDeviation.y()) : (height);
	const int			endZ				= (acceptOutOfBoundsAsAnyValue) ? (depth  - maxPositionDeviation.z()) : (depth);

	TCU_CHECK_INTERNAL(result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth);
	DE_ASSERT(endX > 0 && endY > 0 && endZ > 0);	// most likely a bug

	tcu::clear(errorMask, okColor);

	for (int z = beginZ; z < endZ; z++)
	{
		for (int y = beginY; y < endY; y++)
		{
			for (int x = beginX; x < endX; x++)
			{
				const IVec4	refPix = reference.getPixelInt(x, y, z);
				const IVec4	cmpPix = result.getPixelInt(x, y, z);

				// Exact match
				{
					const UVec4	diff = abs(refPix - cmpPix).cast<deUint32>();
					const bool	isOk = boolAll(lessThanEqual(diff, threshold));

					if (isOk)
						continue;
				}

				// Find matching pixels for both result and reference pixel

				{
					bool pixelFoundForReference = false;

					// Find deviated result pixel for reference

					for (int sz = de::max(0, z - maxPositionDeviation.z()); sz <= de::min(depth  - 1, z + maxPositionDeviation.z()) && !pixelFoundForReference; ++sz)
					for (int sy = de::max(0, y - maxPositionDeviation.y()); sy <= de::min(height - 1, y + maxPositionDeviation.y()) && !pixelFoundForReference; ++sy)
					for (int sx = de::max(0, x - maxPositionDeviation.x()); sx <= de::min(width  - 1, x + maxPositionDeviation.x()) && !pixelFoundForReference; ++sx)
					{
						const IVec4	deviatedCmpPix	= result.getPixelInt(sx, sy, sz);
						const UVec4	diff			= abs(refPix - deviatedCmpPix).cast<deUint32>();
						const bool	isOk			= boolAll(lessThanEqual(diff, threshold));

						pixelFoundForReference		= isOk;
					}

					if (!pixelFoundForReference)
					{
						errorMask.setPixel(errorColor, x, y, z);
						++numFailingPixels;
						continue;
					}
				}
				{
					bool pixelFoundForResult = false;

					// Find deviated reference pixel for result

					for (int sz = de::max(0, z - maxPositionDeviation.z()); sz <= de::min(depth  - 1, z + maxPositionDeviation.z()) && !pixelFoundForResult; ++sz)
					for (int sy = de::max(0, y - maxPositionDeviation.y()); sy <= de::min(height - 1, y + maxPositionDeviation.y()) && !pixelFoundForResult; ++sy)
					for (int sx = de::max(0, x - maxPositionDeviation.x()); sx <= de::min(width  - 1, x + maxPositionDeviation.x()) && !pixelFoundForResult; ++sx)
					{
						const IVec4	deviatedRefPix	= reference.getPixelInt(sx, sy, sz);
						const UVec4	diff			= abs(cmpPix - deviatedRefPix).cast<deUint32>();
						const bool	isOk			= boolAll(lessThanEqual(diff, threshold));

						pixelFoundForResult			= isOk;
					}

					if (!pixelFoundForResult)
					{
						errorMask.setPixel(errorColor, x, y, z);
						++numFailingPixels;
						continue;
					}
				}
			}
		}
	}

	return numFailingPixels;
}